

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar23 [16];
  float fVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar42;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 in_ZMM2 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar10 = 0;
    do {
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = 0x3f8000003f800000;
      auVar62._8_4_ = 0x3f000000;
      auVar62._0_8_ = 0x3f0000003f000000;
      auVar63._12_4_ = 0x3f800000;
      auVar62._12_4_ = 0x3f000000;
      auVar63._16_4_ = 0x3f800000;
      auVar62._16_4_ = 0x3f000000;
      auVar63._20_4_ = 0x3f800000;
      auVar62._20_4_ = 0x3f000000;
      auVar63._24_4_ = 0x3f800000;
      auVar62._24_4_ = 0x3f000000;
      auVar63._28_4_ = 0x3f800000;
      auVar62._28_4_ = 0x3f000000;
      pauVar11 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 8) {
        uVar7 = 0;
      }
      else {
        iVar6 = 7;
        do {
          auVar1 = *pauVar11;
          auVar16._8_4_ = 0x42b0c0a5;
          auVar16._0_8_ = 0x42b0c0a542b0c0a5;
          auVar16._12_4_ = 0x42b0c0a5;
          auVar16._16_4_ = 0x42b0c0a5;
          auVar16._20_4_ = 0x42b0c0a5;
          auVar16._24_4_ = 0x42b0c0a5;
          auVar16._28_4_ = 0x42b0c0a5;
          auVar16 = vminps_avx(auVar1,auVar16);
          auVar17._8_4_ = 0xc2b0c0a5;
          auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar17._12_4_ = 0xc2b0c0a5;
          auVar17._16_4_ = 0xc2b0c0a5;
          auVar17._20_4_ = 0xc2b0c0a5;
          auVar17._24_4_ = 0xc2b0c0a5;
          auVar17._28_4_ = 0xc2b0c0a5;
          auVar17 = vmaxps_avx(auVar16,auVar17);
          auVar31._0_4_ = auVar17._0_4_ * 1.442695 + 0.5;
          auVar31._4_4_ = auVar17._4_4_ * 1.442695 + 0.5;
          auVar31._8_4_ = auVar17._8_4_ * 1.442695 + 0.5;
          auVar31._12_4_ = auVar17._12_4_ * 1.442695 + 0.5;
          auVar31._16_4_ = auVar17._16_4_ * 1.442695 + 0.5;
          auVar31._20_4_ = auVar17._20_4_ * 1.442695 + 0.5;
          auVar31._24_4_ = auVar17._24_4_ * 1.442695 + 0.5;
          auVar31._28_4_ = in_ZMM2._28_4_ + 0.5;
          auVar33 = vroundps_avx(auVar31,1);
          auVar16 = vcmpps_avx(auVar31,auVar33,1);
          auVar16 = vandps_avx(auVar63,auVar16);
          auVar16 = vsubps_avx(auVar33,auVar16);
          auVar3._4_4_ = auVar16._4_4_ * 0.6931472;
          auVar3._0_4_ = auVar16._0_4_ * 0.6931472;
          auVar3._8_4_ = auVar16._8_4_ * 0.6931472;
          auVar3._12_4_ = auVar16._12_4_ * 0.6931472;
          auVar3._16_4_ = auVar16._16_4_ * 0.6931472;
          auVar3._20_4_ = auVar16._20_4_ * 0.6931472;
          auVar3._24_4_ = auVar16._24_4_ * 0.6931472;
          auVar3._28_4_ = auVar33._28_4_;
          auVar17 = vsubps_avx(auVar17,auVar3);
          fVar22 = auVar17._0_4_;
          fVar40 = auVar17._4_4_;
          fVar41 = auVar17._8_4_;
          fVar42 = auVar17._12_4_;
          fVar43 = auVar17._16_4_;
          fVar44 = auVar17._20_4_;
          fVar45 = auVar17._24_4_;
          auVar23._0_4_ = (int)auVar16._0_4_;
          auVar23._4_4_ = (int)auVar16._4_4_;
          auVar23._8_4_ = (int)auVar16._8_4_;
          auVar23._12_4_ = (int)auVar16._12_4_;
          auVar32._16_4_ = (int)auVar16._16_4_;
          auVar32._0_16_ = auVar23;
          auVar32._20_4_ = (int)auVar16._20_4_;
          auVar32._24_4_ = (int)auVar16._24_4_;
          auVar32._28_4_ = (int)auVar16._28_4_;
          auVar46 = vpslld_avx(auVar23,0x17);
          auVar23 = vpslld_avx(auVar32._16_16_,0x17);
          auVar64._8_4_ = 0x3f800000;
          auVar64._0_8_ = 0x3f8000003f800000;
          auVar64._12_4_ = 0x3f800000;
          auVar23 = vpaddd_avx(auVar64,auVar23);
          auVar46 = vpaddd_avx(auVar64,auVar46);
          auVar20._0_4_ =
               (fVar22 + 1.0 +
               fVar22 * fVar22 *
               (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                 0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar46._0_4_ + 1.0;
          auVar20._4_4_ =
               (fVar40 + 1.0 +
               fVar40 * fVar40 *
               (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                 0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar46._4_4_ + 1.0;
          auVar20._8_4_ =
               (fVar41 + 1.0 +
               fVar41 * fVar41 *
               (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar46._8_4_ + 1.0;
          auVar20._12_4_ =
               (fVar42 + 1.0 +
               fVar42 * fVar42 *
               (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                 0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar46._12_4_ + 1.0;
          auVar20._16_4_ =
               (fVar43 + 1.0 +
               fVar43 * fVar43 *
               (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar23._0_4_ + 1.0;
          auVar20._20_4_ =
               (fVar44 + 1.0 +
               fVar44 * fVar44 *
               (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                 0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar23._4_4_ + 1.0;
          auVar20._24_4_ =
               (fVar45 + 1.0 +
               fVar45 * fVar45 *
               (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                 0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5)) * auVar23._8_4_ + 1.0;
          auVar20._28_4_ = auVar17._28_4_ + 1.0 + auVar33._28_4_ + 1.0;
          auVar33._8_4_ = 0x800000;
          auVar33._0_8_ = 0x80000000800000;
          auVar33._12_4_ = 0x800000;
          auVar33._16_4_ = 0x800000;
          auVar33._20_4_ = 0x800000;
          auVar33._24_4_ = 0x800000;
          auVar33._28_4_ = 0x800000;
          auVar33 = vmaxps_avx(auVar20,auVar33);
          auVar23 = vpsrld_avx(auVar33._16_16_,0x17);
          auVar34._8_4_ = 0x807fffff;
          auVar34._0_8_ = 0x807fffff807fffff;
          auVar34._12_4_ = 0x807fffff;
          auVar34._16_4_ = 0x807fffff;
          auVar34._20_4_ = 0x807fffff;
          auVar34._24_4_ = 0x807fffff;
          auVar34._28_4_ = 0x807fffff;
          auVar16 = vandps_avx(auVar33,auVar34);
          auVar3 = vorps_avx(auVar62,auVar16);
          auVar58._8_4_ = 0x3f3504f3;
          auVar58._0_8_ = 0x3f3504f33f3504f3;
          auVar58._12_4_ = 0x3f3504f3;
          auVar58._16_4_ = 0x3f3504f3;
          auVar58._20_4_ = 0x3f3504f3;
          auVar58._24_4_ = 0x3f3504f3;
          auVar58._28_4_ = 0x3f3504f3;
          auVar17 = vcmpps_avx(auVar58,auVar3,2);
          auVar16 = vandnps_avx(auVar17,auVar3);
          fVar22 = auVar3._0_4_ + -1.0 + auVar16._0_4_;
          fVar40 = auVar3._4_4_ + -1.0 + auVar16._4_4_;
          fVar41 = auVar3._8_4_ + -1.0 + auVar16._8_4_;
          fVar42 = auVar3._12_4_ + -1.0 + auVar16._12_4_;
          fVar43 = auVar3._16_4_ + -1.0 + auVar16._16_4_;
          fVar44 = auVar3._20_4_ + -1.0 + auVar16._20_4_;
          fVar45 = auVar3._24_4_ + -1.0 + auVar16._24_4_;
          auVar23 = vpsubd_avx(auVar23,auVar17._16_16_);
          auVar46 = vpsrld_avx(auVar33._0_16_,0x17);
          auVar49._8_4_ = 0xffffff81;
          auVar49._0_8_ = 0xffffff81ffffff81;
          auVar49._12_4_ = 0xffffff81;
          auVar23 = vpaddd_avx(auVar49,auVar23);
          auVar46 = vpsubd_avx(auVar46,auVar17._0_16_);
          auVar46 = vpaddd_avx(auVar49,auVar46);
          auVar53._16_16_ = auVar23;
          auVar53._0_16_ = auVar46;
          auVar17 = vcmpps_avx(auVar20,_DAT_00603060,2);
          auVar33 = vcvtdq2ps_avx(auVar53);
          auVar4._4_4_ = (auVar33._4_4_ * 0.6931472 + fVar40 +
                         fVar40 * fVar40 *
                         (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) *
                                fVar40 + -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057)
                             * fVar40 + 0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) *
                          fVar40 + -0.5)) * -2.0;
          auVar4._0_4_ = (auVar33._0_4_ * 0.6931472 + fVar22 +
                         fVar22 * fVar22 *
                         (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) *
                                fVar22 + -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057)
                             * fVar22 + 0.20000714) * fVar22 + -0.24999994) * fVar22 + 0.3333333) *
                          fVar22 + -0.5)) * -2.0;
          auVar4._8_4_ = (auVar33._8_4_ * 0.6931472 + fVar41 +
                         fVar41 * fVar41 *
                         (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) *
                                fVar41 + -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057)
                             * fVar41 + 0.20000714) * fVar41 + -0.24999994) * fVar41 + 0.3333333) *
                          fVar41 + -0.5)) * -2.0;
          auVar4._12_4_ =
               (auVar33._12_4_ * 0.6931472 + fVar42 +
               fVar42 * fVar42 *
               (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                     -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 +
                  0.20000714) * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5)) * -2.0
          ;
          auVar4._16_4_ =
               (auVar33._16_4_ * 0.6931472 + fVar43 +
               fVar43 * fVar43 *
               (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                     -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 +
                  0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5)) * -2.0
          ;
          auVar4._20_4_ =
               (auVar33._20_4_ * 0.6931472 + fVar44 +
               fVar44 * fVar44 *
               (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                     -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                  0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5)) * -2.0
          ;
          auVar4._24_4_ =
               (auVar33._24_4_ * 0.6931472 + fVar45 +
               fVar45 * fVar45 *
               (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                     -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 +
                  0.20000714) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5)) * -2.0
          ;
          auVar4._28_4_ = auVar33._28_4_ + auVar3._28_4_ + -1.0 + auVar16._28_4_ + 0.0;
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          auVar54._16_4_ = 0x7fffffff;
          auVar54._20_4_ = 0x7fffffff;
          auVar54._24_4_ = 0x7fffffff;
          auVar54._28_4_ = 0x7fffffff;
          auVar16 = vblendvps_avx(auVar4,auVar54,auVar17);
          auVar35._8_4_ = 0x42b0c0a5;
          auVar35._0_8_ = 0x42b0c0a542b0c0a5;
          auVar35._12_4_ = 0x42b0c0a5;
          auVar35._16_4_ = 0x42b0c0a5;
          auVar35._20_4_ = 0x42b0c0a5;
          auVar35._24_4_ = 0x42b0c0a5;
          auVar35._28_4_ = 0x42b0c0a5;
          auVar16 = vminps_avx(auVar16,auVar35);
          auVar36._8_4_ = 0xc2b0c0a5;
          auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar36._12_4_ = 0xc2b0c0a5;
          auVar36._16_4_ = 0xc2b0c0a5;
          auVar36._20_4_ = 0xc2b0c0a5;
          auVar36._24_4_ = 0xc2b0c0a5;
          auVar36._28_4_ = 0xc2b0c0a5;
          auVar17 = vmaxps_avx(auVar16,auVar36);
          auVar37._0_4_ = auVar17._0_4_ * 1.442695 + 0.5;
          auVar37._4_4_ = auVar17._4_4_ * 1.442695 + 0.5;
          auVar37._8_4_ = auVar17._8_4_ * 1.442695 + 0.5;
          auVar37._12_4_ = auVar17._12_4_ * 1.442695 + 0.5;
          auVar37._16_4_ = auVar17._16_4_ * 1.442695 + 0.5;
          auVar37._20_4_ = auVar17._20_4_ * 1.442695 + 0.5;
          auVar37._24_4_ = auVar17._24_4_ * 1.442695 + 0.5;
          auVar37._28_4_ = 0xc2afc0a5;
          auVar33 = vroundps_avx(auVar37,1);
          auVar16 = vcmpps_avx(auVar37,auVar33,1);
          auVar16 = vandps_avx(auVar63,auVar16);
          auVar16 = vsubps_avx(auVar33,auVar16);
          auVar5._4_4_ = auVar16._4_4_ * 0.6931472;
          auVar5._0_4_ = auVar16._0_4_ * 0.6931472;
          auVar5._8_4_ = auVar16._8_4_ * 0.6931472;
          auVar5._12_4_ = auVar16._12_4_ * 0.6931472;
          auVar5._16_4_ = auVar16._16_4_ * 0.6931472;
          auVar5._20_4_ = auVar16._20_4_ * 0.6931472;
          auVar5._24_4_ = auVar16._24_4_ * 0.6931472;
          auVar5._28_4_ = auVar33._28_4_;
          auVar17 = vsubps_avx(auVar17,auVar5);
          fVar22 = auVar17._0_4_;
          fVar40 = auVar17._4_4_;
          fVar41 = auVar17._8_4_;
          fVar42 = auVar17._12_4_;
          fVar43 = auVar17._16_4_;
          fVar44 = auVar17._20_4_;
          fVar45 = auVar17._24_4_;
          auVar46._0_4_ = (int)auVar16._0_4_;
          auVar46._4_4_ = (int)auVar16._4_4_;
          auVar46._8_4_ = (int)auVar16._8_4_;
          auVar46._12_4_ = (int)auVar16._12_4_;
          auVar38._16_4_ = (int)auVar16._16_4_;
          auVar38._0_16_ = auVar46;
          auVar38._20_4_ = (int)auVar16._20_4_;
          auVar38._24_4_ = (int)auVar16._24_4_;
          auVar38._28_4_ = (int)auVar16._28_4_;
          auVar46 = vpslld_avx(auVar46,0x17);
          auVar23 = vpslld_avx(auVar38._16_16_,0x17);
          auVar23 = vpaddd_avx(auVar64,auVar23);
          auVar46 = vpaddd_avx(auVar64,auVar46);
          auVar21._0_4_ =
               (fVar22 + 1.0 +
               fVar22 * fVar22 *
               (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                 0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar46._0_4_ + 1.0;
          auVar21._4_4_ =
               (fVar40 + 1.0 +
               fVar40 * fVar40 *
               (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                 0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar46._4_4_ + 1.0;
          auVar21._8_4_ =
               (fVar41 + 1.0 +
               fVar41 * fVar41 *
               (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar46._8_4_ + 1.0;
          auVar21._12_4_ =
               (fVar42 + 1.0 +
               fVar42 * fVar42 *
               (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                 0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar46._12_4_ + 1.0;
          auVar21._16_4_ =
               (fVar43 + 1.0 +
               fVar43 * fVar43 *
               (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar23._0_4_ + 1.0;
          auVar21._20_4_ =
               (fVar44 + 1.0 +
               fVar44 * fVar44 *
               (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                 0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar23._4_4_ + 1.0;
          auVar21._24_4_ =
               (fVar45 + 1.0 +
               fVar45 * fVar45 *
               (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                 0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5)) * auVar23._8_4_ + 1.0;
          auVar21._28_4_ = auVar17._28_4_ + 1.0 + auVar33._28_4_ + 1.0;
          auVar39._8_4_ = 0x40000000;
          auVar39._0_8_ = 0x4000000040000000;
          auVar39._12_4_ = 0x40000000;
          auVar39._16_4_ = 0x40000000;
          auVar39._20_4_ = 0x40000000;
          auVar39._24_4_ = 0x40000000;
          auVar39._28_4_ = 0x40000000;
          in_ZMM2 = ZEXT3264(auVar39);
          auVar16 = vdivps_avx(auVar39,auVar21);
          local_58 = auVar1._0_4_;
          fStack_54 = auVar1._4_4_;
          fStack_50 = auVar1._8_4_;
          fStack_4c = auVar1._12_4_;
          fStack_48 = auVar1._16_4_;
          fStack_44 = auVar1._20_4_;
          fStack_40 = auVar1._24_4_;
          auVar1._4_4_ = (auVar16._4_4_ + -1.0) * fStack_54;
          auVar1._0_4_ = (auVar16._0_4_ + -1.0) * local_58;
          auVar1._8_4_ = (auVar16._8_4_ + -1.0) * fStack_50;
          auVar1._12_4_ = (auVar16._12_4_ + -1.0) * fStack_4c;
          auVar1._16_4_ = (auVar16._16_4_ + -1.0) * fStack_48;
          auVar1._20_4_ = (auVar16._20_4_ + -1.0) * fStack_44;
          auVar1._24_4_ = (auVar16._24_4_ + -1.0) * fStack_40;
          auVar1._28_4_ = 0x39506967;
          *pauVar11 = auVar1;
          pauVar11 = pauVar11 + 1;
          iVar6 = iVar6 + 8;
          uVar7 = uVar9 & 0xfffffff8;
        } while (iVar6 < (int)uVar9);
      }
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      uVar8 = uVar7 | 3;
      while ((int)uVar8 < (int)uVar9) {
        auVar23 = *(undefined1 (*) [16])*pauVar11;
        auVar60._8_4_ = 0x42b0c0a5;
        auVar60._0_8_ = 0x42b0c0a542b0c0a5;
        auVar60._12_4_ = 0x42b0c0a5;
        auVar46 = vminps_avx(auVar60,auVar23);
        auVar61._8_4_ = 0xc2b0c0a5;
        auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar61._12_4_ = 0xc2b0c0a5;
        auVar64 = vmaxps_avx(auVar61,auVar46);
        auVar13._8_4_ = 0x3f000000;
        auVar13._0_8_ = 0x3f0000003f000000;
        auVar13._12_4_ = 0x3f000000;
        auVar24._0_4_ = auVar64._0_4_ * 1.442695 + 0.5;
        auVar24._4_4_ = auVar64._4_4_ * 1.442695 + 0.5;
        auVar24._8_4_ = auVar64._8_4_ * 1.442695 + 0.5;
        auVar24._12_4_ = auVar64._12_4_ * 1.442695 + 0.5;
        auVar47._0_4_ = (int)auVar24._0_4_;
        auVar47._4_4_ = (int)auVar24._4_4_;
        auVar47._8_4_ = (int)auVar24._8_4_;
        auVar47._12_4_ = (int)auVar24._12_4_;
        auVar49 = vcvtdq2ps_avx(auVar47);
        auVar46 = vcmpps_avx(auVar24,auVar49,1);
        auVar46 = vandps_avx(auVar46,auVar59);
        auVar46 = vsubps_avx(auVar49,auVar46);
        auVar48._0_4_ = auVar46._0_4_ * 0.6931472;
        auVar48._4_4_ = auVar46._4_4_ * 0.6931472;
        auVar48._8_4_ = auVar46._8_4_ * 0.6931472;
        auVar48._12_4_ = auVar46._12_4_ * 0.6931472;
        auVar49 = vsubps_avx(auVar64,auVar48);
        fVar22 = auVar49._0_4_;
        fVar40 = auVar49._4_4_;
        fVar41 = auVar49._8_4_;
        fVar42 = auVar49._12_4_;
        auVar25._0_4_ = (int)auVar46._0_4_;
        auVar25._4_4_ = (int)auVar46._4_4_;
        auVar25._8_4_ = (int)auVar46._8_4_;
        auVar25._12_4_ = (int)auVar46._12_4_;
        auVar46 = vpslld_avx(auVar25,0x17);
        auVar46 = vpaddd_avx(auVar46,auVar59);
        auVar18._0_4_ =
             (fVar22 + 1.0 +
             fVar22 * fVar22 *
             (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
               0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar46._0_4_ + 1.0;
        auVar18._4_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar46._4_4_ + 1.0;
        auVar18._8_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar46._8_4_ + 1.0;
        auVar18._12_4_ =
             (fVar42 + 1.0 +
             fVar42 * fVar42 *
             (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
               0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar46._12_4_ + 1.0;
        auVar26._8_4_ = 0x800000;
        auVar26._0_8_ = 0x80000000800000;
        auVar26._12_4_ = 0x800000;
        auVar46 = vmaxps_avx(auVar18,auVar26);
        auVar49 = vpsrld_avx(auVar46,0x17);
        auVar55._8_4_ = 0xffffff82;
        auVar55._0_8_ = 0xffffff82ffffff82;
        auVar55._12_4_ = 0xffffff82;
        auVar49 = vpaddd_avx(auVar49,auVar55);
        auVar56._8_4_ = 0x807fffff;
        auVar56._0_8_ = 0x807fffff807fffff;
        auVar56._12_4_ = 0x807fffff;
        auVar46 = vandps_avx(auVar46,auVar56);
        auVar13 = vorps_avx(auVar46,auVar13);
        auVar64 = vcvtdq2ps_avx(auVar49);
        auVar57._8_4_ = 0x3f3504f3;
        auVar57._0_8_ = 0x3f3504f33f3504f3;
        auVar57._12_4_ = 0x3f3504f3;
        auVar49 = vcmpps_avx(auVar13,auVar57,1);
        auVar46 = vandps_avx(auVar49,auVar13);
        fVar22 = auVar13._0_4_ + -1.0 + auVar46._0_4_;
        fVar40 = auVar13._4_4_ + -1.0 + auVar46._4_4_;
        fVar41 = auVar13._8_4_ + -1.0 + auVar46._8_4_;
        fVar42 = auVar13._12_4_ + -1.0 + auVar46._12_4_;
        auVar46 = vandps_avx(auVar49,auVar59);
        auVar49 = vsubps_avx(auVar64,auVar46);
        auVar46 = vcmpps_avx(auVar18,_DAT_00601810,2);
        auVar27._0_4_ =
             (auVar49._0_4_ * 0.6931472 + fVar22 +
             fVar22 * fVar22 *
             (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) * fVar22 +
                   -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057) * fVar22 + 0.20000714
                ) * fVar22 + -0.24999994) * fVar22 + 0.3333333) * fVar22 + -0.5)) * -2.0;
        auVar27._4_4_ =
             (auVar49._4_4_ * 0.6931472 + fVar40 +
             fVar40 * fVar40 *
             (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                   -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 + 0.20000714
                ) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5)) * -2.0;
        auVar27._8_4_ =
             (auVar49._8_4_ * 0.6931472 + fVar41 +
             fVar41 * fVar41 *
             (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                   -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714
                ) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5)) * -2.0;
        auVar27._12_4_ =
             (auVar49._12_4_ * 0.6931472 + fVar42 +
             fVar42 * fVar42 *
             (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                   -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 + 0.20000714
                ) * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5)) * -2.0;
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar46 = vblendvps_avx(auVar27,auVar50,auVar46);
        auVar28._8_4_ = 0x42b0c0a5;
        auVar28._0_8_ = 0x42b0c0a542b0c0a5;
        auVar28._12_4_ = 0x42b0c0a5;
        auVar46 = vminps_avx(auVar46,auVar28);
        auVar64 = vmaxps_avx(auVar61,auVar46);
        auVar29._0_4_ = auVar64._0_4_ * 1.442695 + 0.5;
        auVar29._4_4_ = auVar64._4_4_ * 1.442695 + 0.5;
        auVar29._8_4_ = auVar64._8_4_ * 1.442695 + 0.5;
        auVar29._12_4_ = auVar64._12_4_ * 1.442695 + 0.5;
        auVar51._0_4_ = (int)auVar29._0_4_;
        auVar51._4_4_ = (int)auVar29._4_4_;
        auVar51._8_4_ = (int)auVar29._8_4_;
        auVar51._12_4_ = (int)auVar29._12_4_;
        auVar49 = vcvtdq2ps_avx(auVar51);
        auVar46 = vcmpps_avx(auVar29,auVar49,1);
        auVar46 = vandps_avx(auVar46,auVar59);
        auVar46 = vsubps_avx(auVar49,auVar46);
        auVar52._0_4_ = auVar46._0_4_ * 0.6931472;
        auVar52._4_4_ = auVar46._4_4_ * 0.6931472;
        auVar52._8_4_ = auVar46._8_4_ * 0.6931472;
        auVar52._12_4_ = auVar46._12_4_ * 0.6931472;
        auVar49 = vsubps_avx(auVar64,auVar52);
        fVar22 = auVar49._0_4_;
        fVar40 = auVar49._4_4_;
        fVar41 = auVar49._8_4_;
        fVar42 = auVar49._12_4_;
        auVar30._0_4_ = (int)auVar46._0_4_;
        auVar30._4_4_ = (int)auVar46._4_4_;
        auVar30._8_4_ = (int)auVar46._8_4_;
        auVar30._12_4_ = (int)auVar46._12_4_;
        auVar46 = vpslld_avx(auVar30,0x17);
        auVar46 = vpaddd_avx(auVar46,auVar59);
        in_ZMM2 = ZEXT1664(auVar46);
        auVar19._0_4_ =
             (fVar22 + 1.0 +
             fVar22 * fVar22 *
             (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
               0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar46._0_4_ + 1.0;
        auVar19._4_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar46._4_4_ + 1.0;
        auVar19._8_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar46._8_4_ + 1.0;
        auVar19._12_4_ =
             (fVar42 + 1.0 +
             fVar42 * fVar42 *
             (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
               0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar46._12_4_ + 1.0;
        auVar14._8_4_ = 0x40000000;
        auVar14._0_8_ = 0x4000000040000000;
        auVar14._12_4_ = 0x40000000;
        auVar46 = vdivps_avx(auVar14,auVar19);
        auVar15._0_4_ = auVar23._0_4_ * (auVar46._0_4_ + -1.0);
        auVar15._4_4_ = auVar23._4_4_ * (auVar46._4_4_ + -1.0);
        auVar15._8_4_ = auVar23._8_4_ * (auVar46._8_4_ + -1.0);
        auVar15._12_4_ = auVar23._12_4_ * (auVar46._12_4_ + -1.0);
        *(undefined1 (*) [16])*pauVar11 = auVar15;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        uVar8 = uVar7 + 7;
        uVar7 = uVar7 + 4;
      }
      if (uVar9 - uVar7 != 0 && (int)uVar7 <= (int)uVar9) {
        lVar12 = 0;
        do {
          fVar22 = *(float *)(*pauVar11 + lVar12 * 4);
          in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
          fVar40 = expf(fVar22);
          fVar40 = logf(fVar40 + 1.0);
          fVar40 = tanhf(fVar40);
          *(float *)(*pauVar11 + lVar12 * 4) = fVar40 * fVar22;
          lVar12 = lVar12 + 1;
        } while (uVar9 - uVar7 != (int)lVar12);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}